

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O1

unsigned_long xmlSchemaValDecimalGetSignificantDigitCount(xmlSchemaValDecimal *decimal)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  
  bVar3 = true;
  if (decimal->fractionalPlaces == 1) {
    bVar3 = decimal->str[(ulong)decimal->integralPlaces + 2] != '0';
  }
  uVar2 = decimal->integralPlaces;
  if (uVar2 == 1) {
    uVar2 = (uint)(decimal->str[1] != '0');
  }
  uVar1 = 0;
  if (bVar3) {
    uVar1 = decimal->fractionalPlaces;
  }
  return (ulong)(uVar1 + uVar2 + (uint)(uVar2 + uVar1 == 0));
}

Assistant:

static unsigned long
xmlSchemaValDecimalGetSignificantDigitCount(const xmlSchemaValDecimal *decimal)
{
	unsigned fractionalPlaces = xmlSchemaValDecimalIsInteger(decimal) ? 0 : decimal->fractionalPlaces;
	unsigned integralPlaces = decimal->integralPlaces;
	if(integralPlaces == 1 && decimal->str[1] == '0')
	{
		integralPlaces = 0;
	}
	if(integralPlaces+fractionalPlaces == 0)
	{
		/* 0, but that's still 1 significant digit */
		return 1;
	}
	return integralPlaces+fractionalPlaces;
}